

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_chunk_append(uchar **out,size_t *outsize,uchar *chunk)

{
  ulong uVar1;
  uint uVar2;
  long lVar3;
  uchar *puVar4;
  ulong uVar5;
  ulong uVar6;
  
  lVar3 = 4;
  do {
    if (0x19 < (byte)((chunk[lVar3] & 0xdf) + 0xbf)) {
      return 0x79;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  uVar2 = 0x7a;
  if ((chunk[6] & 0x20) == 0) {
    uVar2 = *(uint *)chunk;
    uVar6 = (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18)
            + 0xc;
    uVar1 = *outsize;
    uVar2 = 0x4d;
    if (!CARRY8(uVar6,uVar1)) {
      puVar4 = (uchar *)realloc(*out,uVar6 + uVar1);
      if (puVar4 == (uchar *)0x0) {
        uVar2 = 0x53;
      }
      else {
        *out = puVar4;
        *outsize = uVar6 + uVar1;
        uVar2 = 0;
        uVar5 = 0;
        do {
          puVar4[uVar5 + uVar1] = chunk[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar6 != (uVar5 & 0xffffffff));
      }
    }
  }
  return uVar2;
}

Assistant:

unsigned lodepng_chunk_append(unsigned char** out, size_t* outsize, const unsigned char* chunk) {
  unsigned i;
  size_t total_chunk_length, new_length;
  unsigned char *chunk_start, *new_buffer;

  if(!lodepng_chunk_type_name_valid(chunk)) {
    return 121; /* invalid chunk type name */
  }
  if(lodepng_chunk_reserved(chunk)) {
    return 122; /* invalid third lowercase character */
  }

  if(lodepng_addofl(lodepng_chunk_length(chunk), 12, &total_chunk_length)) return 77;
  if(lodepng_addofl(*outsize, total_chunk_length, &new_length)) return 77;

  new_buffer = (unsigned char*)lodepng_realloc(*out, new_length);
  if(!new_buffer) return 83; /*alloc fail*/
  (*out) = new_buffer;
  (*outsize) = new_length;
  chunk_start = &(*out)[new_length - total_chunk_length];

  for(i = 0; i != total_chunk_length; ++i) chunk_start[i] = chunk[i];

  return 0;
}